

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_ScrollParchment(double dmapx,double dmapy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FTexture *this;
  int pheight;
  int pwidth;
  FTexture *backtex;
  double dmapy_local;
  double dmapx_local;
  
  mapxstart = mapxstart - dmapx * scale_mtof;
  mapystart = mapystart - dmapy * scale_mtof;
  mapxstart = clamp<double>(mapxstart,-40000.0,40000.0);
  mapystart = clamp<double>(mapystart,-40000.0,40000.0);
  bVar1 = FTextureID::isValid(&mapback);
  if ((bVar1) && (this = FTextureManager::operator[](&TexMan,mapback), this != (FTexture *)0x0)) {
    iVar2 = FTexture::GetWidth(this);
    iVar3 = FTexture::GetHeight(this);
    for (; 0.0 < mapxstart; mapxstart = mapxstart - (double)iVar2) {
    }
    for (; mapxstart <= (double)-iVar2; mapxstart = (double)iVar2 + mapxstart) {
    }
    for (; 0.0 < mapystart; mapystart = mapystart - (double)iVar3) {
    }
    for (; mapystart <= (double)-iVar3; mapystart = (double)iVar3 + mapystart) {
    }
  }
  return;
}

Assistant:

static void AM_ScrollParchment (double dmapx, double dmapy)
{
	mapxstart = mapxstart - dmapx * scale_mtof;
	mapystart = mapystart - dmapy * scale_mtof;

	mapxstart = clamp(mapxstart, -40000., 40000.);
	mapystart = clamp(mapystart, -40000., 40000.);

	if (mapback.isValid())
	{
		FTexture *backtex = TexMan[mapback];

		if (backtex != NULL)
		{
			int pwidth = backtex->GetWidth();
			int pheight = backtex->GetHeight();

			while(mapxstart > 0)
				mapxstart -= pwidth;
			while(mapxstart <= -pwidth)
				mapxstart += pwidth;
			while(mapystart > 0)
				mapystart -= pheight;
			while(mapystart <= -pheight)
				mapystart += pheight;
		}
	}
}